

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

intptr_t fio_fd2uuid(int fd)

{
  ulong uVar1;
  long lVar2;
  fio_lock_i ret;
  
  uVar1 = 0xffffffffffffffff;
  if ((-1 < fd) && ((uint)fd < fio_data->capa)) {
    lVar2 = (ulong)(uint)fd * 0xa8;
    if (*(char *)((long)fio_data + lVar2 + 0x6f) == '\0') {
      fio_lock((fio_lock_i *)((long)fio_data + lVar2 + 0x6c));
      fio_clear_fd((ulong)(uint)fd,'\x01');
      LOCK();
      *(undefined1 *)((long)fio_data + lVar2 + 0x6c) = 0;
      UNLOCK();
    }
    uVar1 = (ulong)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar2 + 0x6d));
  }
  return uVar1;
}

Assistant:

intptr_t fio_fd2uuid(int fd) {
  if (fd < 0 || (size_t)fd >= fio_data->capa)
    return -1;
  if (!fd_data(fd).open) {
    fio_lock(&fd_data(fd).protocol_lock);
    fio_clear_fd(fd, 1);
    fio_unlock(&fd_data(fd).protocol_lock);
  }
  return fd2uuid(fd);
}